

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Base.cpp
# Opt level: O0

void __thiscall mbc::Val::ValBase::~ValBase(ValBase *this)

{
  string *this_00;
  ValBase *this_local;
  
  this->_vptr_ValBase = (_func_int **)&PTR__ValBase_001926b0;
  *this->count_ = *this->count_ + -1;
  if (*this->count_ == 0) {
    if (this->count_ != (int *)0x0) {
      operator_delete(this->count_);
    }
    this_00 = this->invaild_waring_;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
      operator_delete(this_00);
    }
    if (this->is_vaild_ != (bool *)0x0) {
      operator_delete(this->is_vaild_);
    }
    if (this->type_ != (Type *)0x0) {
      operator_delete(this->type_);
    }
  }
  return;
}

Assistant:

ValBase::~ValBase() {
    -- *count_;
    if(*count_ == 0) {
        delete count_;
        delete invaild_waring_;
        delete is_vaild_;
        delete type_;
    }
}